

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O3

void __thiscall Imf_3_4::DeepScanLineInputFile::Data::initialize(Data *this)

{
  exr_storage_t eVar1;
  int iVar2;
  ArgExc *this_00;
  
  eVar1 = Context::storage(this->_ctxt,this->partNumber);
  if (eVar1 == EXR_STORAGE_DEEP_SCANLINE) {
    iVar2 = Context::version(this->_ctxt);
    this->version = iVar2;
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,"File part is not a deep scanline part");
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void initialize ()
    {
        if (_ctxt->storage (partNumber) != EXR_STORAGE_DEEP_SCANLINE)
            throw IEX_NAMESPACE::ArgExc ("File part is not a deep scanline part");

        version = _ctxt->version ();
    }